

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

optional<cmListFileContext> * __thiscall
cmListFileParser::CheckNesting
          (optional<cmListFileContext> *__return_storage_ptr__,cmListFileParser *this)

{
  pointer pNVar1;
  bool bVar2;
  pointer pcVar3;
  string *__lhs;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var4;
  _Optional_payload_base<cmListFileContext> *p_Var5;
  vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  stack;
  allocator<char> local_389;
  pointer local_388;
  cmListFileParser *local_380;
  vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  local_378;
  _Optional_payload_base<cmListFileContext> *local_358;
  string local_350;
  value_type local_330;
  pointer local_2b8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_378.
  super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (this->ListFile->Functions).
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_2b8 = (this->ListFile->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_380 = this;
  local_358 = (_Optional_payload_base<cmListFileContext> *)__return_storage_ptr__;
  do {
    p_Var5 = local_358;
    if (pcVar3 == local_2b8) {
      if (local_378.
          super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_378.
          super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_358->_M_engaged = false;
      }
      else {
        std::_Optional_payload_base<cmListFileContext>::_Optional_payload_base<cmListFileContext&>
                  (local_358,
                   &local_378.
                    super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].Context);
      }
LAB_0022576b:
      std::
      vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
      ::~vector(&local_378);
      return (optional<cmListFileContext> *)p_Var5;
    }
    __lhs = &((pcVar3->Impl).
              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->LowerCaseName;
    local_388 = pcVar3;
    bVar2 = std::operator==(__lhs,"if");
    if (bVar2) {
      local_330.State = If;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,local_380->FileName,&local_389);
      local_1e8._M_engaged = false;
      cmListFileContext::FromListFileFunction
                (&local_330.Context,local_388,&local_350,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8);
      std::
      vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
      ::push_back(&local_378,&local_330);
      cmListFileContext::~cmListFileContext(&local_330.Context);
      p_Var4 = &local_1e8;
LAB_002251f3:
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(p_Var4);
      std::__cxx11::string::~string((string *)&local_350);
    }
    else {
      bVar2 = std::operator==(__lhs,"elseif");
      pNVar1 = local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar2) {
        if ((local_378.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_378.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (local_378.
            super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].State == If)) {
          local_330.State = If;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,local_380->FileName,&local_389);
          local_80._M_engaged = false;
          cmListFileContext::FromListFileFunction
                    (&local_330.Context,local_388,&local_350,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80);
          anon_unknown.dwarf_6cc1e4::NestingState::operator=(pNVar1 + -1,&local_330);
          cmListFileContext::~cmListFileContext(&local_330.Context);
          p_Var4 = &local_80;
          goto LAB_002251f3;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,local_380->FileName,&local_389);
        local_58._M_engaged = false;
        cmListFileContext::FromListFileFunction
                  ((cmListFileContext *)&local_330,local_388,&local_350,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58);
        p_Var5 = local_358;
        std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                  ((optional<cmListFileContext> *)local_358,(cmListFileContext *)&local_330);
        cmListFileContext::~cmListFileContext((cmListFileContext *)&local_330);
        p_Var4 = &local_58;
LAB_0022575c:
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(p_Var4);
        std::__cxx11::string::~string((string *)&local_350);
        goto LAB_0022576b;
      }
      bVar2 = std::operator==(__lhs,"else");
      pNVar1 = local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar2) {
        if ((local_378.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_378.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (local_378.
            super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].State != If)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,local_380->FileName,&local_389);
          local_a8._M_engaged = false;
          cmListFileContext::FromListFileFunction
                    ((cmListFileContext *)&local_330,local_388,&local_350,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8);
          p_Var5 = local_358;
          std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                    ((optional<cmListFileContext> *)local_358,(cmListFileContext *)&local_330);
          cmListFileContext::~cmListFileContext((cmListFileContext *)&local_330);
          p_Var4 = &local_a8;
          goto LAB_0022575c;
        }
        local_330.State = Else;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,local_380->FileName,&local_389);
        local_d0._M_engaged = false;
        cmListFileContext::FromListFileFunction
                  (&local_330.Context,local_388,&local_350,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0);
        anon_unknown.dwarf_6cc1e4::NestingState::operator=(pNVar1 + -1,&local_330);
        cmListFileContext::~cmListFileContext(&local_330.Context);
        p_Var4 = &local_d0;
        goto LAB_002251f3;
      }
      bVar2 = std::operator==(__lhs,"endif");
      if (bVar2) {
        if ((local_378.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_378.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (Else < local_378.
                   super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].State)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,local_380->FileName,&local_389);
          local_f8._M_engaged = false;
          cmListFileContext::FromListFileFunction
                    ((cmListFileContext *)&local_330,local_388,&local_350,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f8);
          p_Var5 = local_358;
          std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                    ((optional<cmListFileContext> *)local_358,(cmListFileContext *)&local_330);
          cmListFileContext::~cmListFileContext((cmListFileContext *)&local_330);
          p_Var4 = &local_f8;
          goto LAB_0022575c;
        }
LAB_00225168:
        pNVar1 = local_378.
                 super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_378.
        super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_378.
             super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        cmListFileContext::~cmListFileContext(&pNVar1->Context);
      }
      else {
        bVar2 = std::operator==(__lhs,"while");
        if (bVar2) {
          local_330.State = While;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,local_380->FileName,&local_389);
          local_210._M_engaged = false;
          cmListFileContext::FromListFileFunction
                    (&local_330.Context,local_388,&local_350,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_210);
          std::
          vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
          ::push_back(&local_378,&local_330);
          cmListFileContext::~cmListFileContext(&local_330.Context);
          p_Var4 = &local_210;
          goto LAB_002251f3;
        }
        bVar2 = std::operator==(__lhs,"endwhile");
        if (bVar2) {
          if ((local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (local_378.
              super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].State != While)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_350,local_380->FileName,&local_389);
            local_120._M_engaged = false;
            cmListFileContext::FromListFileFunction
                      ((cmListFileContext *)&local_330,local_388,&local_350,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_120);
            p_Var5 = local_358;
            std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                      ((optional<cmListFileContext> *)local_358,(cmListFileContext *)&local_330);
            cmListFileContext::~cmListFileContext((cmListFileContext *)&local_330);
            p_Var4 = &local_120;
            goto LAB_0022575c;
          }
          goto LAB_00225168;
        }
        bVar2 = std::operator==(__lhs,"foreach");
        if (bVar2) {
          local_330.State = Foreach;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,local_380->FileName,&local_389);
          local_238._M_engaged = false;
          cmListFileContext::FromListFileFunction
                    (&local_330.Context,local_388,&local_350,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_238);
          std::
          vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
          ::push_back(&local_378,&local_330);
          cmListFileContext::~cmListFileContext(&local_330.Context);
          p_Var4 = &local_238;
          goto LAB_002251f3;
        }
        bVar2 = std::operator==(__lhs,"endforeach");
        if (bVar2) {
          if ((local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (local_378.
              super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].State != Foreach)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_350,local_380->FileName,&local_389);
            local_148._M_engaged = false;
            cmListFileContext::FromListFileFunction
                      ((cmListFileContext *)&local_330,local_388,&local_350,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148);
            p_Var5 = local_358;
            std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                      ((optional<cmListFileContext> *)local_358,(cmListFileContext *)&local_330);
            cmListFileContext::~cmListFileContext((cmListFileContext *)&local_330);
            p_Var4 = &local_148;
            goto LAB_0022575c;
          }
          goto LAB_00225168;
        }
        bVar2 = std::operator==(__lhs,"function");
        if (bVar2) {
          local_330.State = Function;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,local_380->FileName,&local_389);
          local_260._M_engaged = false;
          cmListFileContext::FromListFileFunction
                    (&local_330.Context,local_388,&local_350,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_260);
          std::
          vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
          ::push_back(&local_378,&local_330);
          cmListFileContext::~cmListFileContext(&local_330.Context);
          p_Var4 = &local_260;
          goto LAB_002251f3;
        }
        bVar2 = std::operator==(__lhs,"endfunction");
        if (bVar2) {
          if ((local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (local_378.
              super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].State != Function)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_350,local_380->FileName,&local_389);
            local_170._M_engaged = false;
            cmListFileContext::FromListFileFunction
                      ((cmListFileContext *)&local_330,local_388,&local_350,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_170);
            p_Var5 = local_358;
            std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                      ((optional<cmListFileContext> *)local_358,(cmListFileContext *)&local_330);
            cmListFileContext::~cmListFileContext((cmListFileContext *)&local_330);
            p_Var4 = &local_170;
            goto LAB_0022575c;
          }
          goto LAB_00225168;
        }
        bVar2 = std::operator==(__lhs,"macro");
        if (bVar2) {
          local_330.State = Macro;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,local_380->FileName,&local_389);
          local_288._M_engaged = false;
          cmListFileContext::FromListFileFunction
                    (&local_330.Context,local_388,&local_350,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_288);
          std::
          vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
          ::push_back(&local_378,&local_330);
          cmListFileContext::~cmListFileContext(&local_330.Context);
          p_Var4 = &local_288;
          goto LAB_002251f3;
        }
        bVar2 = std::operator==(__lhs,"endmacro");
        if (bVar2) {
          if ((local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (local_378.
              super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].State != Macro)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_350,local_380->FileName,&local_389);
            local_198._M_engaged = false;
            cmListFileContext::FromListFileFunction
                      ((cmListFileContext *)&local_330,local_388,&local_350,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198);
            p_Var5 = local_358;
            std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                      ((optional<cmListFileContext> *)local_358,(cmListFileContext *)&local_330);
            cmListFileContext::~cmListFileContext((cmListFileContext *)&local_330);
            p_Var4 = &local_198;
            goto LAB_0022575c;
          }
          goto LAB_00225168;
        }
        bVar2 = std::operator==(__lhs,"block");
        if (bVar2) {
          local_330.State = Block;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,local_380->FileName,&local_389);
          local_2b0._M_engaged = false;
          cmListFileContext::FromListFileFunction
                    (&local_330.Context,local_388,&local_350,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2b0);
          std::
          vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
          ::push_back(&local_378,&local_330);
          cmListFileContext::~cmListFileContext(&local_330.Context);
          p_Var4 = &local_2b0;
          goto LAB_002251f3;
        }
        bVar2 = std::operator==(__lhs,"endblock");
        if (bVar2) {
          if ((local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_378.
               super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (local_378.
              super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].State != Block)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_350,local_380->FileName,&local_389);
            local_1c0._M_engaged = false;
            cmListFileContext::FromListFileFunction
                      ((cmListFileContext *)&local_330,local_388,&local_350,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0);
            p_Var5 = local_358;
            std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                      ((optional<cmListFileContext> *)local_358,(cmListFileContext *)&local_330);
            cmListFileContext::~cmListFileContext((cmListFileContext *)&local_330);
            p_Var4 = &local_1c0;
            goto LAB_0022575c;
          }
          goto LAB_00225168;
        }
      }
    }
    pcVar3 = local_388 + 1;
  } while( true );
}

Assistant:

cm::optional<cmListFileContext> cmListFileParser::CheckNesting() const
{
  std::vector<NestingState> stack;

  for (auto const& func : this->ListFile->Functions) {
    auto const& name = func.LowerCaseName();
    if (name == "if") {
      stack.push_back({
        NestingStateEnum::If,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "elseif") {
      if (!TopIs(stack, NestingStateEnum::If)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.back() = {
        NestingStateEnum::If,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      };
    } else if (name == "else") {
      if (!TopIs(stack, NestingStateEnum::If)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.back() = {
        NestingStateEnum::Else,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      };
    } else if (name == "endif") {
      if (!TopIs(stack, NestingStateEnum::If) &&
          !TopIs(stack, NestingStateEnum::Else)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "while") {
      stack.push_back({
        NestingStateEnum::While,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endwhile") {
      if (!TopIs(stack, NestingStateEnum::While)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "foreach") {
      stack.push_back({
        NestingStateEnum::Foreach,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endforeach") {
      if (!TopIs(stack, NestingStateEnum::Foreach)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "function") {
      stack.push_back({
        NestingStateEnum::Function,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endfunction") {
      if (!TopIs(stack, NestingStateEnum::Function)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "macro") {
      stack.push_back({
        NestingStateEnum::Macro,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endmacro") {
      if (!TopIs(stack, NestingStateEnum::Macro)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "block") {
      stack.push_back({
        NestingStateEnum::Block,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endblock") {
      if (!TopIs(stack, NestingStateEnum::Block)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    }
  }

  if (!stack.empty()) {
    return stack.back().Context;
  }

  return cm::nullopt;
}